

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O0

void __thiscall
tcu::Exception::Exception(Exception *this,char *message,char *expr,char *file,int line)

{
  int in_R9D;
  char *local_80;
  allocator<char> local_5d [13];
  string local_50;
  int local_2c;
  char *pcStack_28;
  int line_local;
  char *file_local;
  char *expr_local;
  char *message_local;
  Exception *this_local;
  
  local_2c = line;
  pcStack_28 = file;
  file_local = expr;
  expr_local = message;
  message_local = (char *)this;
  formatError_abi_cxx11_(&local_50,(tcu *)message,expr,file,(char *)(ulong)(uint)line,in_R9D);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__Exception_00ca1030;
  if (expr_local == (char *)0x0) {
    local_80 = "Runtime check failed";
  }
  else {
    local_80 = expr_local;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_message,local_80,local_5d);
  std::allocator<char>::~allocator(local_5d);
  return;
}

Assistant:

Exception::Exception (const char* message, const char* expr, const char* file, int line)
	: std::runtime_error(formatError(message, expr, file, line))
	, m_message			(message ? message : "Runtime check failed")
{
}